

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper_tests.cpp
# Opt level: O2

void wallet::feebumper::feebumper_tests::external_max_weight_test_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_wrap_stringstream<char> *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  pointer local_b98;
  pointer local_b90;
  char *local_b88;
  char *local_b80;
  pointer local_b78;
  pointer local_b70;
  char *local_b68;
  char *local_b60;
  pointer local_b58;
  pointer local_b50;
  char *local_b48;
  char *local_b40;
  pointer local_b38;
  pointer local_b30;
  char *local_b28;
  char *local_b20;
  pointer local_b18;
  pointer local_b10;
  char *local_b08;
  char *local_b00;
  basic_wrap_stringstream<char> local_af8;
  external_max_weight_test t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_b00 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"external_max_weight_test");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_b18 = (pbVar3->_M_dataplus)._M_p;
  local_b10 = local_b18 + pbVar3->_M_string_length;
  file.m_end = (iterator)0x2a;
  file.m_begin = (iterator)&local_b08;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_b18,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  external_max_weight_test::external_max_weight_test(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_b20 = "";
  memset(&local_af8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_af8);
  std::operator<<((ostream *)&local_af8,'\"');
  std::operator<<((ostream *)&local_af8,"external_max_weight_test");
  std::operator<<((ostream *)&local_af8,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_af8);
  local_b38 = (pbVar3->_M_dataplus)._M_p;
  local_b30 = local_b38 + pbVar3->_M_string_length;
  file_00.m_end = (iterator)0x2a;
  file_00.m_begin = (iterator)&local_b28;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_b38,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_af8);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_b40 = "";
  memset(&local_af8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_af8);
  std::operator<<((ostream *)&local_af8,'\"');
  std::operator<<((ostream *)&local_af8,"external_max_weight_test");
  std::operator<<((ostream *)&local_af8,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_af8);
  local_b58 = (pbVar3->_M_dataplus)._M_p;
  local_b50 = local_b58 + pbVar3->_M_string_length;
  file_01.m_end = (iterator)0x2a;
  file_01.m_begin = (iterator)&local_b48;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_b58,msg_01);
  this = &local_af8;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  external_max_weight_test::test_method((external_max_weight_test *)this);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_b60 = "";
  memset(&local_af8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_af8);
  std::operator<<((ostream *)&local_af8,'\"');
  std::operator<<((ostream *)&local_af8,"external_max_weight_test");
  std::operator<<((ostream *)&local_af8,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_af8);
  local_b78 = (pbVar3->_M_dataplus)._M_p;
  local_b70 = local_b78 + pbVar3->_M_string_length;
  file_02.m_end = (iterator)0x2a;
  file_02.m_begin = (iterator)&local_b68;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_b78,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_af8);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/feebumper_tests.cpp"
  ;
  local_b80 = "";
  memset(&local_af8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_af8);
  std::operator<<((ostream *)&local_af8,'\"');
  std::operator<<((ostream *)&local_af8,"external_max_weight_test");
  std::operator<<((ostream *)&local_af8,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_af8);
  local_b98 = (pbVar3->_M_dataplus)._M_p;
  local_b90 = local_b98 + pbVar3->_M_string_length;
  file_03.m_end = (iterator)0x2a;
  file_03.m_begin = (iterator)&local_b88;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_b98,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_af8);
  WalletTestingSetup::~WalletTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(external_max_weight_test)
{
    // P2PKH
    CheckMaxWeightComputation("453042021f03c8957c5ce12940ee6e3333ecc3f633d9a1ac53a55b3ce0351c617fa96abe021f0dccdcce3ef45a63998be9ec748b561baf077b8e862941d0cd5ec08f5afe68012102fccfeb395f0ecd3a77e7bc31c3bc61dc987418b18e395d441057b42ca043f22c", {}, "76a914f60dcfd3392b28adc7662669603641f578eed72d88ac", 593);
    // P2SH-P2WPKH
    CheckMaxWeightComputation("160014001dca1b22c599b5a56a87c78417ad2ff39552f1", {"3042021f5443c58eaf45f3e5ef46f8516f966b334a7d497cedda4edb2b9fad57c90c3b021f63a77cb56cde848e2e2dd20b487eec2f53101f634193786083f60b4d23a82301", "026cfe86116f161057deb240201d6b82ebd4f161e0200d63dc9aca65a1d6b38bb7"}, "a9147c8ab5ad7708b97ccb6b483d57aba48ee85214df87", 364);
    // P2WPKH
    CheckMaxWeightComputation("", {"3042021f0f8906f0394979d5b737134773e5b88bf036c7d63542301d600ab677ba5a59021f0e9fe07e62c113045fa1c1532e2914720e8854d189c4f5b8c88f57956b704401", "0359edba11ed1a0568094a6296a16c4d5ee4c8cfe2f5e2e6826871b5ecf8188f79"}, "00149961a78658030cc824af4c54fbf5294bec0cabdd", 272);
    // P2WSH HTLC
    CheckMaxWeightComputation("", {"3042021f5c4c29e6b686aae5b6d0751e90208592ea96d26bc81d78b0d3871a94a21fa8021f74dc2f971e438ccece8699c8fd15704c41df219ab37b63264f2147d15c34d801", "01", "6321024cf55e52ec8af7866617dc4e7ff8433758e98799906d80e066c6f32033f685f967029000b275210214827893e2dcbe4ad6c20bd743288edad21100404eb7f52ccd6062fd0e7808f268ac"}, "002089e84892873c679b1129edea246e484fd914c2601f776d4f2f4a001eb8059703", 318);
}